

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O3

int io_file_write(lua_State *L,IOFileUD *iof,int start)

{
  int iVar1;
  ulong in_RAX;
  char *__ptr;
  size_t sVar2;
  uint stat;
  TValue *o;
  TValue *pTVar3;
  MSize len;
  undefined8 uStack_38;
  
  o = L->base + (uint)start;
  stat = 1;
  if (o < L->top) {
    pTVar3 = L->base + (uint)start;
    stat = 1;
    uStack_38 = in_RAX;
    do {
      __ptr = lj_strfmt_wstrnum(L,o,(MSize *)((long)&uStack_38 + 4));
      if (__ptr == (char *)0x0) {
        lj_err_argt(L,(int)((ulong)((long)pTVar3 - (long)L->base) >> 3) + 1,4);
      }
      if (stat == 0) {
        stat = 0;
      }
      else {
        sVar2 = fwrite(__ptr,1,uStack_38 >> 0x20,(FILE *)iof);
        stat = (uint)(sVar2 == uStack_38 >> 0x20);
      }
      o = o + 1;
      pTVar3 = pTVar3 + 1;
    } while (o < L->top);
  }
  iVar1 = luaL_fileresult(L,stat,(char *)0x0);
  return iVar1;
}

Assistant:

static int io_file_write(lua_State *L, IOFileUD *iof, int start)
{
  FILE *fp = iof->fp;
  cTValue *tv;
  int status = 1;
  for (tv = L->base+start; tv < L->top; tv++) {
    MSize len;
    const char *p = lj_strfmt_wstrnum(L, tv, &len);
    if (!p)
      lj_err_argt(L, (int)(tv - L->base) + 1, LUA_TSTRING);
    status = status && (fwrite(p, 1, len, fp) == len);
  }
  if (LJ_52 && status) {
    L->top = L->base+1;
    if (start == 0)
      setudataV(L, L->base, IOSTDF_UD(L, GCROOT_IO_OUTPUT));
    return 1;
  }
  return luaL_fileresult(L, status, NULL);
}